

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.cpp
# Opt level: O0

void ProcessEDSector(sector_t_conflict *sec,int recordnum)

{
  int pos;
  sector_t_conflict *this;
  short local_40;
  TAngle<double> local_38;
  int local_30;
  undefined4 local_2c;
  int i;
  DWORD pflagmask;
  BYTE leak;
  EDSector *pEStack_20;
  DWORD flagmask;
  EDSector *esec;
  sector_t_conflict *psStack_10;
  int recordnum_local;
  sector_t_conflict *sec_local;
  
  esec._4_4_ = recordnum;
  psStack_10 = sec;
  pEStack_20 = TMap<int,_EDSector,_THashTraits<int>,_TValueTraits<EDSector>_>::CheckKey
                         (&EDSectors,recordnum);
  if (pEStack_20 == (EDSector *)0x0) {
    Printf("EDF Sector record %d not found\n",(ulong)esec._4_4_);
  }
  else {
    pflagmask = 0xc0000071;
    if ((pEStack_20->flagsSet & 1U) != 0) {
      psStack_10->Flags = psStack_10->Flags & 0x3fffff8e;
    }
    psStack_10->Flags =
         (psStack_10->Flags | pEStack_20->flags | pEStack_20->flagsAdd) &
         (pEStack_20->flagsRemove ^ 0xffffffff);
    i._3_1_ = 0;
    if ((pEStack_20->damageflagsSet & 1U) == 0) {
      if (psStack_10->leakydamage < 0x100) {
        i._3_1_ = 4 < psStack_10->leakydamage;
      }
      else {
        i._3_1_ = 2;
      }
    }
    else {
      psStack_10->Flags = psStack_10->Flags & 0xfffff87f;
    }
    psStack_10->Flags =
         (psStack_10->Flags | pEStack_20->damageflags | pEStack_20->damageflagsAdd) &
         (pEStack_20->damageflagsRemove ^ 0xffffffff);
    i._3_1_ = (i._3_1_ | pEStack_20->leaky | pEStack_20->leakyadd) &
              (pEStack_20->leakyremove ^ 0xff);
    if (i._3_1_ == 0) {
      local_40 = 0;
    }
    else {
      local_40 = 0x100;
      if (i._3_1_ == 1) {
        local_40 = 5;
      }
    }
    psStack_10->leakydamage = local_40;
    psStack_10->damageamount = pEStack_20->damageamount;
    psStack_10->damageinterval = (short)pEStack_20->damageinterval;
    FNameNoInit::operator=(&psStack_10->damagetype,&pEStack_20->damagetype);
    psStack_10->terrainnum[0] = pEStack_20->floorterrain;
    psStack_10->terrainnum[1] = pEStack_20->ceilingterrain;
    if ((pEStack_20->colorSet & 1U) != 0) {
      sector_t::SetColor((sector_t *)psStack_10,pEStack_20->color >> 0x10 & 0xff,
                         pEStack_20->color >> 8 & 0xff,pEStack_20->color & 0xff,0);
    }
    local_2c = 0x7c;
    for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
      sector_t::SetXOffset((sector_t *)psStack_10,local_30,pEStack_20->xoffs[local_30]);
      sector_t::SetYOffset((sector_t *)psStack_10,local_30,pEStack_20->yoffs[local_30]);
      this = psStack_10;
      pos = local_30;
      TAngle<double>::TAngle(&local_38,pEStack_20->angle + local_30);
      sector_t::SetAngle((sector_t *)this,pos,&local_38);
      sector_t::SetAlpha((sector_t *)psStack_10,local_30,pEStack_20->Overlayalpha[local_30]);
      psStack_10->planes[local_30].Flags =
           psStack_10->planes[local_30].Flags & 0xffffff83U | pEStack_20->portalflags[local_30];
    }
  }
  return;
}

Assistant:

void ProcessEDSector(sector_t *sec, int recordnum)
{
	EDSector *esec = EDSectors.CheckKey(recordnum);
	if (esec == NULL)
	{
		Printf("EDF Sector record %d not found\n", recordnum);
		return;
	}

	// In ZDoom the regular and the damage flags are part of the same flag word so we need to do some masking.
	const DWORD flagmask = SECF_SECRET | SECF_WASSECRET | SECF_FRICTION | SECF_PUSH | SECF_SILENT | SECF_SILENTMOVE;
	if (esec->flagsSet) sec->Flags = (sec->Flags & ~flagmask);
	sec->Flags = (sec->Flags | esec->flags | esec->flagsAdd) & ~esec->flagsRemove;

	BYTE leak = 0;
	if (esec->damageflagsSet) sec->Flags = (sec->Flags & ~SECF_DAMAGEFLAGS);
	else leak = sec->leakydamage >= 256 ? 2 : sec->leakydamage >= 5 ? 1 : 0;
	sec->Flags = (sec->Flags | esec->damageflags | esec->damageflagsAdd) & ~esec->damageflagsRemove;
	leak = (leak | esec->leaky | esec->leakyadd) & ~esec->leakyremove;

	// the damage properties will be unconditionally overridden by Extradata.
	sec->leakydamage = leak == 0 ? 0 : leak == 1 ? 5 : 256;
	sec->damageamount = esec->damageamount;
	sec->damageinterval = esec->damageinterval;
	sec->damagetype = esec->damagetype;

	sec->terrainnum[sector_t::floor] = esec->floorterrain;
	sec->terrainnum[sector_t::ceiling] = esec->ceilingterrain;

	if (esec->colorSet) sec->SetColor(RPART(esec->color), GPART(esec->color), BPART(esec->color), 0);

	const DWORD pflagmask = PLANEF_DISABLED | PLANEF_NORENDER | PLANEF_NOPASS | PLANEF_BLOCKSOUND | PLANEF_ADDITIVE;
	for (int i = 0; i < 2; i++)
	{
		sec->SetXOffset(i, esec->xoffs[i]);
		sec->SetYOffset(i, esec->yoffs[i]);
		sec->SetAngle(i, esec->angle[i]);
		sec->SetAlpha(i, esec->Overlayalpha[i]);
		sec->planes[i].Flags = (sec->planes[i].Flags & ~pflagmask) | esec->portalflags[i];
	}
}